

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGeneratorTarget::GetPackageReferences_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this)

{
  string_view arg;
  bool bVar1;
  string *this_00;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmValue vsPackageReferences;
  cmGeneratorTarget *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *packageReferences;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = IsInBuildSystem(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"VS_PACKAGE_REFERENCES",&local_59);
    local_38 = GetProperty(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    bVar1 = cmValue::operator_cast_to_bool(&local_38);
    if (bVar1) {
      this_00 = cmValue::operator*[abi_cxx11_(&local_38);
      arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
      ;
      cmExpandList(arg,__return_storage_ptr__,false);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmGeneratorTarget::GetPackageReferences() const
{
  std::vector<std::string> packageReferences;

  if (this->IsInBuildSystem()) {
    if (cmValue vsPackageReferences =
          this->GetProperty("VS_PACKAGE_REFERENCES")) {
      cmExpandList(*vsPackageReferences, packageReferences);
    }
  }

  return packageReferences;
}